

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O1

void object_curses_find_to_h(player *p,object *obj)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong i;
  
  i = 0xffffffff;
  if (rune_max != 0) {
    piVar1 = &rune_list->index;
    uVar2 = 0;
    do {
      if ((((rune *)(piVar1 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar1 == 1)) {
        i = uVar2 & 0xffffffff;
        break;
      }
      uVar2 = uVar2 + 1;
      piVar1 = piVar1 + 6;
    } while (rune_max != uVar2);
  }
  if ((obj->curses != (curse_data *)0x0) && (1 < z_info->curse_max)) {
    uVar2 = 1;
    do {
      if (((obj->curses[uVar2].power != L'\0') && (curses[uVar2].obj != (object *)0x0)) &&
         ((curses[uVar2].obj)->to_h != 0)) {
        player_learn_rune(p,(long)(int)i,true);
        i = 0xffffffff;
        if (rune_max != 0) {
          piVar1 = &rune_list->index;
          uVar3 = 0;
          do {
            if ((((rune *)(piVar1 + -1))->variety == RUNE_VAR_CURSE) && (uVar2 == (uint)*piVar1)) {
              i = uVar3 & 0xffffffff;
              break;
            }
            uVar3 = uVar3 + 1;
            piVar1 = piVar1 + 6;
          } while (rune_max != uVar3);
        }
        if (-1 < (int)i) {
          player_learn_rune(p,i,true);
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < z_info->curse_max);
  }
  return;
}

Assistant:

static void object_curses_find_to_h(struct player *p, struct object *obj)
{
	int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			if (curses[i].obj->to_h != 0) {
				player_learn_rune(p, index, true);

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}
}